

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_25635b::NullBackend::open(NullBackend *this,char *__file,int __oflag,...)

{
  ALCdevice *pAVar1;
  char *pcVar2;
  int iVar3;
  backend_exception *this_00;
  
  if (__file == (char *)0x0) {
    __file = "No Output";
  }
  else {
    iVar3 = strcmp(__file,"No Output");
    if (iVar3 != 0) {
      this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(this_00,0xa004,"Device name \"%s\" not found",__file)
      ;
      __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
  }
  pAVar1 = (this->super_BackendBase).mDevice;
  pcVar2 = (char *)(pAVar1->DeviceName)._M_string_length;
  strlen(__file);
  iVar3 = std::__cxx11::string::_M_replace((ulong)&pAVar1->DeviceName,0,pcVar2,(ulong)__file);
  return iVar3;
}

Assistant:

void NullBackend::open(const ALCchar *name)
{
    if(!name)
        name = nullDevice;
    else if(strcmp(name, nullDevice) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mDevice->DeviceName = name;
}